

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pack_dev.c
# Opt level: O0

dev_t pack_bsdos(int n,u_long *numbers,char **error)

{
  ulong uVar1;
  dev_t dev;
  char **error_local;
  u_long *numbers_local;
  int n_local;
  
  dev = 0;
  if (n == 2) {
    dev = (*numbers & 0xfff) << 0x14 | numbers[1] & 0xfffff;
    if ((long)(int)(*numbers & 0xfff) != *numbers) {
      *error = "invalid major number";
    }
    if ((long)(int)((uint)dev & 0xfffff) != numbers[1]) {
      *error = "invalid minor number";
    }
  }
  else if (n == 3) {
    uVar1 = (*numbers & 0xfff) << 0x14 | (numbers[1] & 0xfff) << 8;
    dev = uVar1 | numbers[2] & 0xff;
    if ((long)(int)(*numbers & 0xfff) != *numbers) {
      *error = "invalid major number";
    }
    if ((long)(int)((uint)(uVar1 >> 8) & 0xfff) != numbers[1]) {
      *error = "invalid unit number";
    }
    if ((long)(int)((uint)dev & 0xff) != numbers[2]) {
      *error = "invalid subunit number";
    }
  }
  else {
    *error = "too many fields for format";
  }
  return dev;
}

Assistant:

static dev_t
pack_bsdos(int n, u_long numbers[], const char **error)
{
	dev_t dev = 0;

	if (n == 2) {
		dev = makedev_12_20(numbers[0], numbers[1]);
		if ((u_long)major_12_20(dev) != numbers[0])
			*error = iMajorError;
		if ((u_long)minor_12_20(dev) != numbers[1])
			*error = iMinorError;
	} else if (n == 3) {
		dev = makedev_12_12_8(numbers[0], numbers[1], numbers[2]);
		if ((u_long)major_12_12_8(dev) != numbers[0])
			*error = iMajorError;
		if ((u_long)unit_12_12_8(dev) != numbers[1])
			*error = "invalid unit number";
		if ((u_long)subunit_12_12_8(dev) != numbers[2])
			*error = "invalid subunit number";
	} else
		*error = tooManyFields;
	return (dev);
}